

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigRefineClass_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pClass)

{
  Ivy_FraigList_t *pList;
  uint uVar1;
  uint uVar2;
  Ivy_Obj_t *pObj1;
  Ivy_Obj_t *pIVar3;
  int iVar4;
  long lVar5;
  Ivy_Obj_t *pIVar6;
  int iVar7;
  Ivy_Obj_t *pIVar8;
  long lVar9;
  Ivy_Obj_t **ppIVar10;
  
  pList = &p->lClasses;
  iVar7 = 0;
  pObj1 = pClass;
  do {
    do {
      pIVar6 = pObj1;
      pObj1 = pIVar6->pNextFan1;
      if (pObj1 == (Ivy_Obj_t *)0x0) {
        iVar4 = 0;
LAB_00628c68:
        return iVar4 + iVar7;
      }
      iVar4 = Ivy_NodeCompareSims(p,pClass,pObj1);
    } while (iVar4 != 0);
    if (p->pParams->fPatScores != 0) {
      pIVar8 = pClass->pFanout;
      pIVar3 = pObj1->pFanout;
      for (lVar5 = 0; lVar5 < p->nSimWords; lVar5 = lVar5 + 1) {
        uVar1 = *(uint *)((long)&pIVar8->pFanout + lVar5 * 4);
        uVar2 = *(uint *)((long)&pIVar3->pFanout + lVar5 * 4);
        if (uVar1 != uVar2) {
          for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
            if (((uVar2 ^ uVar1) >> ((uint)lVar9 & 0x1f) & 1) != 0) {
              p->pPatScores[(ulong)((uint)lVar5 & 0x7ffffff) * 0x20 + lVar9] =
                   p->pPatScores[(ulong)((uint)lVar5 & 0x7ffffff) * 0x20 + lVar9] + 1;
            }
          }
        }
      }
    }
    pObj1->pNextFan0 = (Ivy_Obj_t *)0x0;
    pIVar8 = pObj1;
    ppIVar10 = &pObj1->pNextFan1;
    while (pIVar3 = *ppIVar10, pIVar3 != (Ivy_Obj_t *)0x0) {
      iVar4 = Ivy_NodeCompareSims(p,pClass,pIVar3);
      if (iVar4 == 0) {
        pIVar8->pNextFan1 = pIVar3;
        pIVar3->pNextFan0 = pObj1;
        pIVar8 = pIVar3;
      }
      else {
        pIVar6->pNextFan1 = pIVar3;
        pIVar6 = pIVar3;
      }
      ppIVar10 = &pIVar3->pNextFan1;
    }
    pIVar8->pNextFan1 = (Ivy_Obj_t *)0x0;
    pIVar6->pNextFan1 = (Ivy_Obj_t *)0x0;
    Ivy_FraigInsertClass(pList,pClass,pObj1);
    if (pClass->pNextFan1 == (Ivy_Obj_t *)0x0) {
      Ivy_FraigRemoveClass(pList,pClass);
    }
    if (pObj1->pNextFan1 == (Ivy_Obj_t *)0x0) {
      Ivy_FraigRemoveClass(pList,pObj1);
      iVar4 = 1;
      goto LAB_00628c68;
    }
    iVar7 = iVar7 + 1;
    pClass = pObj1;
  } while( true );
}

Assistant:

int Ivy_FraigRefineClass_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pClass )
{
    Ivy_Obj_t * pClassNew, * pListOld, * pListNew, * pNode;
    int RetValue = 0;
    // check if there is refinement
    pListOld = pClass;
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClass), pClassNew )
    {
        if ( !Ivy_NodeCompareSims(p, pClass, pClassNew) )
        {
            if ( p->pParams->fPatScores )
                Ivy_FraigAddToPatScores( p, pClass, pClassNew );
            break;
        }
        pListOld = pClassNew;
    }
    if ( pClassNew == NULL )
        return 0;
    // set representative of the new class
    Ivy_ObjSetClassNodeRepr( pClassNew, NULL );
    // start the new list
    pListNew = pClassNew;
    // go through the remaining nodes and sort them into two groups:
    // (1) matches of the old node; (2) non-matches of the old node
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClassNew), pNode )
        if ( Ivy_NodeCompareSims( p, pClass, pNode ) )
        {
            Ivy_ObjSetClassNodeNext( pListOld, pNode );
            pListOld = pNode;
        }
        else
        {
            Ivy_ObjSetClassNodeNext( pListNew, pNode );
            Ivy_ObjSetClassNodeRepr( pNode, pClassNew );
            pListNew = pNode;
        }
    // finish both lists
    Ivy_ObjSetClassNodeNext( pListNew, NULL );
    Ivy_ObjSetClassNodeNext( pListOld, NULL );
    // update the list of classes
    Ivy_FraigInsertClass( &p->lClasses, pClass, pClassNew );
    // if the old class is trivial, remove it
    if ( Ivy_ObjClassNodeNext(pClass) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClass );
    // if the new class is trivial, remove it; otherwise, try to refine it
    if ( Ivy_ObjClassNodeNext(pClassNew) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClassNew );
    else
        RetValue = Ivy_FraigRefineClass_rec( p, pClassNew );
    return RetValue + 1;
}